

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

void __thiscall
capnp::FlatArrayMessageReader::FlatArrayMessageReader
          (FlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array,ReaderOptions options)

{
  uint uVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  Array<kj::ArrayPtr<const_capnp::word>_> *this_00;
  unsigned_long *puVar3;
  long lVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  word *pwVar7;
  uint uVar8;
  ReaderOptions options_00;
  Fault f;
  size_t offset;
  Array<kj::ArrayPtr<const_capnp::word>_> *local_60;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  
  puVar5 = (unsigned_long *)array.size_;
  pwVar7 = array.ptr;
  options_00._8_8_ = options._8_8_ & 0xffffffff;
  options_00.traversalLimitInWords = options.traversalLimitInWords;
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__FlatArrayMessageReader_00669b40;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  this->end = pwVar7 + (long)puVar5;
  if (puVar5 != (unsigned_long *)0x0) {
    local_60 = &this->moreSegments;
    uVar1 = (uint)pwVar7->content;
    uVar8 = uVar1 + 1;
    puVar3 = (unsigned_long *)(ulong)((uVar8 >> 1) + 1);
    _kjCondition.right = &offset;
    _kjCondition.op.content.ptr = " >= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = puVar3 <= puVar5;
    _kjCondition.left = (unsigned_long)puVar5;
    if (puVar5 < puVar3) {
      offset = (size_t)puVar3;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[43]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                 ,0x2f,FAILED,"array.size() >= offset",
                 "_kjCondition,\"Message ends prematurely in segment table.\"",&_kjCondition,
                 (char (*) [43])"Message ends prematurely in segment table.");
      kj::_::Debug::Fault::~Fault(&f);
    }
    else {
      uVar6 = (ulong)*(uint *)((long)&pwVar7->content + 4);
      offset = (long)puVar3 + uVar6;
      _kjCondition.op.content.ptr = " >= ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = offset <= puVar5;
      _kjCondition.right = (unsigned_long *)offset;
      if (puVar5 < offset) {
        offset = (size_t)puVar3;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[43]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                   ,0x37,FAILED,"array.size() >= offset + segmentSize",
                   "_kjCondition,\"Message ends prematurely in first segment.\"",
                   (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                   (char (*) [43])"Message ends prematurely in first segment.");
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        (this->segment0).ptr = pwVar7 + (long)puVar3;
        (this->segment0).size_ = uVar6;
        if (1 < uVar8) {
          _kjCondition.left =
               (unsigned_long)
               kj::_::HeapArrayDisposer::allocate<kj::ArrayPtr<capnp::word_const>>
                         ((size_t)(ulong)uVar1);
          _kjCondition.op.content.ptr = (char *)&kj::_::HeapArrayDisposer::instance;
          _kjCondition.right = (unsigned_long *)(ulong)uVar1;
          kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
                    (local_60,(Array<kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition);
          kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array
                    ((Array<kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition);
          this_00 = local_60;
          for (lVar4 = 0; (ulong)uVar8 * 4 + -4 != lVar4; lVar4 = lVar4 + 4) {
            uVar6 = (ulong)*(uint *)((long)&pwVar7[1].content + lVar4);
            _kjCondition.right = (unsigned_long *)(offset + uVar6);
            _kjCondition.op.content.ptr = " >= ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = _kjCondition.right <= puVar5;
            if (puVar5 < _kjCondition.right) {
              _kjCondition.left = (unsigned_long)puVar5;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[26]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                         ,0x45,FAILED,"array.size() >= offset + segmentSize",
                         "_kjCondition,\"Message ends prematurely.\"",
                         (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                         (char (*) [26])"Message ends prematurely.");
              kj::Array<kj::ArrayPtr<const_capnp::word>_>::dispose(this_00);
              kj::_::Debug::Fault::~Fault(&f);
              return;
            }
            pAVar2 = local_60->ptr;
            *(word **)((long)&pAVar2->ptr + lVar4 * 4) = pwVar7 + offset;
            *(ulong *)((long)&pAVar2->size_ + lVar4 * 4) = uVar6;
            offset = offset + uVar6;
          }
        }
        this->end = pwVar7 + offset;
      }
    }
  }
  return;
}

Assistant:

FlatArrayMessageReader::FlatArrayMessageReader(
    kj::ArrayPtr<const word> array, ReaderOptions options)
    : MessageReader(options), end(array.end()) {
  if (array.size() < 1) {
    // Assume empty message.
    return;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  KJ_REQUIRE(array.size() >= offset, "Message ends prematurely in segment table.") {
    return;
  }

  {
    uint segmentSize = table[1].get();

    KJ_REQUIRE(array.size() >= offset + segmentSize,
               "Message ends prematurely in first segment.") {
      return;
    }

    segment0 = array.slice(offset, offset + segmentSize);
    offset += segmentSize;
  }

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);

    for (uint i = 1; i < segmentCount; i++) {
      uint segmentSize = table[i + 1].get();

      KJ_REQUIRE(array.size() >= offset + segmentSize, "Message ends prematurely.") {
        moreSegments = nullptr;
        return;
      }

      moreSegments[i - 1] = array.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  end = array.begin() + offset;
}